

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

void __thiscall
cmCTestMultiProcessHandler::StartTestProcess(cmCTestMultiProcessHandler *this,int test)

{
  PropertiesMap *this_00;
  _Rb_tree_header *p_Var1;
  map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> *this_01;
  cmCTest *pcVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  undefined8 this_03;
  bool bVar3;
  ostream *poVar4;
  mapped_type_conflict1 *pmVar5;
  mapped_type *ppcVar6;
  cmCTestRunTest *pcVar7;
  _Base_ptr p_Var8;
  ulong uVar9;
  bool collapse;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar10;
  cmCTestRunTest *testRun;
  string current_dir;
  int local_1dc;
  cmCTestRunTest *local_1d8 [2];
  undefined1 local_1c8 [36];
  undefined4 uStack_1a4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_1dc = test;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1c8 + 0x20));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1c8 + 0x20),"test ",5);
  poVar4 = (ostream *)std::ostream::operator<<(local_1c8 + 0x20,test);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  pcVar2 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x7f,(char *)local_1d8[0],this->Quiet);
  if (local_1d8[0] != (cmCTestRunTest *)local_1c8) {
    operator_delete(local_1d8[0],local_1c8._0_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1c8 + 0x20));
  std::ios_base::~ios_base(local_138);
  this_01 = &this->TestRunningMap;
  pmVar5 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
           operator[](this_01,&local_1dc);
  *pmVar5 = true;
  EraseTest(this,local_1dc);
  local_1c8._32_4_ = local_1dc;
  this_00 = &this->Properties;
  ppcVar6 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&this_00->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,(key_type *)(local_1c8 + 0x20));
  uVar9 = (long)(*ppcVar6)->Processors;
  if (this->ParallelLevel < (ulong)(long)(*ppcVar6)->Processors) {
    uVar9 = this->ParallelLevel;
  }
  this->RunningCount = this->RunningCount + uVar9;
  pcVar7 = (cmCTestRunTest *)operator_new(0x210);
  cmCTestRunTest::cmCTestRunTest(pcVar7,this->TestHandler);
  pcVar2 = this->CTest;
  if (pcVar2->RepeatUntilFail == true) {
    pcVar7->RunUntilFail = true;
    pcVar7->NumberOfRunsLeft = pcVar2->RepeatTests;
  }
  pcVar7->Index = local_1dc;
  local_1d8[0] = pcVar7;
  ppcVar6 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&this_00->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_1dc);
  pcVar7->TestProperties = *ppcVar6;
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)(local_1c8 + 0x20),(SystemTools *)0x1,collapse);
  ppcVar6 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&this_00->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_1dc);
  cmsys::SystemTools::ChangeDirectory(&(*ppcVar6)->Directory);
  LockResources(this,local_1dc);
  bVar3 = cmCTestRunTest::StartTest(pcVar7,this->Total);
  if (bVar3) {
    std::
    _Rb_tree<cmCTestRunTest*,cmCTestRunTest*,std::_Identity<cmCTestRunTest*>,std::less<cmCTestRunTest*>,std::allocator<cmCTestRunTest*>>
    ::_M_insert_unique<cmCTestRunTest*const&>
              ((_Rb_tree<cmCTestRunTest*,cmCTestRunTest*,std::_Identity<cmCTestRunTest*>,std::less<cmCTestRunTest*>,std::allocator<cmCTestRunTest*>>
                *)&this->RunningTests,local_1d8);
  }
  else {
    if (pcVar7->StopTimePassed == true) {
      this->StopTimePassed = true;
      cmCTestRunTest::~cmCTestRunTest(pcVar7);
      operator_delete(pcVar7,0x210);
      goto LAB_002e9a37;
    }
    p_Var8 = (this->Tests).
             super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->Tests).
              super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    local_1c8._16_8_ = this_01;
    if ((_Rb_tree_header *)p_Var8 != p_Var1) {
      do {
        pVar10 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                 ::equal_range((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                                *)&p_Var8[1]._M_parent,&local_1dc);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_erase_aux((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      *)&p_Var8[1]._M_parent,(_Base_ptr)pVar10.first._M_node,
                     (_Base_ptr)pVar10.second._M_node);
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != p_Var1);
    }
    UnlockResources(this,local_1dc);
    this_03 = local_1c8._16_8_;
    this->Completed = this->Completed + 1;
    pmVar5 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
             operator[](&this->TestFinishMap,&local_1dc);
    *pmVar5 = true;
    pmVar5 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
             operator[]((map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
                         *)this_03,&local_1dc);
    *pmVar5 = false;
    local_1c8._28_4_ = local_1dc;
    ppcVar6 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&this_00->
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,(key_type *)(local_1c8 + 0x1c));
    pcVar7 = local_1d8[0];
    uVar9 = (long)(*ppcVar6)->Processors;
    if (this->ParallelLevel < (ulong)(long)(*ppcVar6)->Processors) {
      uVar9 = this->ParallelLevel;
    }
    this->RunningCount = this->RunningCount - uVar9;
    cmCTestRunTest::EndTest(local_1d8[0],this->Completed,this->Total,false);
    this_02 = this->Failed;
    ppcVar6 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&this_00->
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,&local_1dc);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this_02,&(*ppcVar6)->Name);
    cmCTestRunTest::~cmCTestRunTest(pcVar7);
    operator_delete(pcVar7,0x210);
  }
  cmsys::SystemTools::ChangeDirectory((string *)(local_1c8 + 0x20));
LAB_002e9a37:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(uStack_1a4,local_1c8._32_4_) != local_198) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(uStack_1a4,local_1c8._32_4_),local_198[0]._M_allocated_capacity + 1)
    ;
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::StartTestProcess(int test)
{
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
    "test " << test << "\n", this->Quiet);
  this->TestRunningMap[test] = true; // mark the test as running
  // now remove the test itself
  this->EraseTest(test);
  this->RunningCount += GetProcessorsUsed(test);

  cmCTestRunTest* testRun = new cmCTestRunTest(this->TestHandler);
  if(this->CTest->GetRepeatUntilFail())
    {
    testRun->SetRunUntilFailOn();
    testRun->SetNumberOfRuns(this->CTest->GetTestRepeat());
    }
  testRun->SetIndex(test);
  testRun->SetTestProperties(this->Properties[test]);

  std::string current_dir = cmSystemTools::GetCurrentWorkingDirectory();
  cmSystemTools::ChangeDirectory(this->Properties[test]->Directory);

  // Lock the resources we'll be using
  this->LockResources(test);

  if(testRun->StartTest(this->Total))
    {
    this->RunningTests.insert(testRun);
    }
  else if(testRun->IsStopTimePassed())
    {
    this->StopTimePassed = true;
    delete testRun;
    return;
    }
  else
    {

    for(TestMap::iterator j = this->Tests.begin();
      j != this->Tests.end(); ++j)
      {
      j->second.erase(test);
      }

    this->UnlockResources(test);
    this->Completed++;
    this->TestFinishMap[test] = true;
    this->TestRunningMap[test] = false;
    this->RunningCount -= GetProcessorsUsed(test);
    testRun->EndTest(this->Completed, this->Total, false);
    this->Failed->push_back(this->Properties[test]->Name);
    delete testRun;
    }
  cmSystemTools::ChangeDirectory(current_dir);
}